

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_persistence_from_file.h
# Opt level: O0

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,string *filename,int dimension,
          double what_to_substitute_for_infinite_bar)

{
  double dVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  double dVar6;
  size_t i_2;
  pair<double,_double> local_a8;
  pair<double,_double> local_98;
  size_type local_88;
  size_t i_1;
  size_t i;
  undefined1 local_68 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> barcode_initial;
  string line;
  double dStack_28;
  bool dbg;
  double what_to_substitute_for_infinite_bar_local;
  string *psStack_18;
  int dimension_local;
  string *filename_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *final_barcode;
  
  dStack_28 = what_to_substitute_for_infinite_bar;
  what_to_substitute_for_infinite_bar_local._4_4_ = dimension;
  psStack_18 = filename;
  filename_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string
            ((string *)
             &barcode_initial.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  read_persistence_intervals_in_dimension
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_68,psStack_18,what_to_substitute_for_infinite_bar_local._4_4_);
  i._3_1_ = 0;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (__return_storage_ptr__);
  sVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                    ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      *)local_68);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::reserve
            (__return_storage_ptr__,sVar2);
  for (local_88 = 0; sVar2 = local_88,
      sVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )local_68), sVar2 != sVar3; local_88 = local_88 + 1) {
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_68,local_88);
    dVar1 = pvVar4->first;
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_68,local_88);
    if (dVar1 < pvVar4->second || dVar1 == pvVar4->second) {
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_68,local_88);
      dVar1 = pvVar4->second;
      dVar6 = std::numeric_limits<double>::infinity();
      if ((dVar1 != dVar6) || (NAN(dVar1) || NAN(dVar6))) {
        pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_68,local_88);
        pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_68,local_88);
        std::pair<double,_double>::pair<double_&,_double_&,_true>
                  (&local_a8,&pvVar4->first,&pvVar5->second);
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back(__return_storage_ptr__,&local_a8);
      }
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_68,local_88);
      dVar1 = pvVar4->second;
      dVar6 = std::numeric_limits<double>::infinity();
      if ((((dVar1 == dVar6) && (!NAN(dVar1) && !NAN(dVar6))) &&
          ((dStack_28 != -1.0 || (NAN(dStack_28))))) &&
         (pvVar4 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_68,local_88), pvVar4->first < dStack_28)) {
        pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)local_68,local_88);
        std::pair<double,_double>::pair<double_&,_double_&,_true>
                  ((pair<double,_double> *)&i_2,&pvVar4->first,&stack0xffffffffffffffd8);
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back(__return_storage_ptr__,(value_type *)&i_2);
      }
    }
    else {
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_68,local_88);
      pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_68,local_88);
      std::pair<double,_double>::pair<double_&,_double_&,_true>
                (&local_98,&pvVar4->second,&pvVar5->first);
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
                (__return_storage_ptr__,&local_98);
    }
  }
  i._3_1_ = 1;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_68);
  std::__cxx11::string::~string
            ((string *)
             &barcode_initial.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double> > read_persistence_intervals_in_one_dimension_from_file(
    std::string const& filename, int dimension = -1, double what_to_substitute_for_infinite_bar = -1) {
  bool dbg = false;

  std::string line;
  std::vector<std::pair<double, double> > barcode_initial =
      read_persistence_intervals_in_dimension(filename, static_cast<int>(dimension));
  std::vector<std::pair<double, double> > final_barcode;
  final_barcode.reserve(barcode_initial.size());

  if (dbg) {
    std::clog << "Here are the intervals that we read from the file : \n";
    for (size_t i = 0; i != barcode_initial.size(); ++i) {
      std::clog << barcode_initial[i].first << " " << barcode_initial[i].second << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != barcode_initial.size(); ++i) {
    if (dbg) {
      std::clog << "Considering interval : " << barcode_initial[i].first << " " << barcode_initial[i].second
                << std::endl;
    }

    if (barcode_initial[i].first > barcode_initial[i].second) {
      // note that in this case barcode_initial[i].second != std::numeric_limits<double>::infinity()
      if (dbg) std::clog << "Swap and enter \n";
      // swap them to make sure that birth < death
      final_barcode.push_back(std::pair<double, double>(barcode_initial[i].second, barcode_initial[i].first));
      continue;
    } else {
      if (barcode_initial[i].second != std::numeric_limits<double>::infinity()) {
        if (dbg) std::clog << "Simply enters\n";
        // in this case, due to the previous conditions we know that barcode_initial[i].first <
        // barcode_initial[i].second, so we put them as they are
        final_barcode.push_back(std::pair<double, double>(barcode_initial[i].first, barcode_initial[i].second));
      }
    }

    if ((barcode_initial[i].second == std::numeric_limits<double>::infinity()) &&
        (what_to_substitute_for_infinite_bar != -1)) {
      if (barcode_initial[i].first < what_to_substitute_for_infinite_bar) {
        // if only birth < death.
        final_barcode.push_back(
            std::pair<double, double>(barcode_initial[i].first, what_to_substitute_for_infinite_bar));
      }
    } else {
      // if the variable what_to_substitute_for_infinite_bar is not set, then we ignore all the infinite bars.
    }
  }

  if (dbg) {
    std::clog << "Here are the final bars that we are sending further : \n";
    for (size_t i = 0; i != final_barcode.size(); ++i) {
      std::clog << final_barcode[i].first << " " << final_barcode[i].second << std::endl;
    }
    std::clog << "final_barcode.size() : " << final_barcode.size() << std::endl;
    getchar();
  }

  return final_barcode;
}